

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::tag<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  undefined1 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  bool bVar4;
  Result<wasm::WATParser::TypeUse> *__x;
  ImportNames *pIVar5;
  ImportNames *pIVar6;
  string_view expected;
  Name NVar7;
  undefined1 local_148 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_118;
  string local_100;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  size_t local_90;
  undefined1 local_88 [8];
  Result<wasm::WATParser::TypeUse> type;
  Result<wasm::WATParser::TypeUse> _val_2;
  
  this = &ctx->in;
  sVar3 = (ctx->in).pos;
  expected._M_str = "tag";
  expected._M_len = 3;
  bVar4 = Lexer::takeSExprStart(this,expected);
  if (bVar4) {
    Lexer::takeID((optional<wasm::Name> *)local_148,this);
    if (exports.val.
        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
        super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[8] == '\0') {
      import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_index =
           '\0';
      import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._33_7_ = 0;
      local_90 = 0;
    }
    else {
      import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._32_8_ =
           exports.val.
           super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._0_8_;
      local_90 = (size_t)local_148;
    }
    inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_148,this);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_c0,
                    (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_148);
    if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u.
        _24_1_ == '\x01') {
      puVar1 = (undefined1 *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8);
      local_88 = (undefined1  [8])puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_c0,
                 import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                 _M_u._M_first._M_storage.mod.super_IString.str._M_len + (long)local_c0);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      if (local_88 == (undefined1  [8])puVar1) {
        *puVar2 = type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._8_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
           type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                         *)local_c0);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                         *)local_c0);
      inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_c0,this);
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
                 local_88,(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           *)local_c0);
      if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage
          ._M_storage[0x18] == '\x02') {
        puVar1 = (undefined1 *)
                 ((long)&_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8);
        type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = puVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                   local_88,(undefined1 *)
                            (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u.
                             _0_8_ + (long)local_88));
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
        if ((undefined1 *)
            type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ == puVar1) {
          *puVar2 = CONCAT71(_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u.
                             _9_7_,_val_2.val.
                                   super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                   ._M_u._M_first._M_storage._M_storage[8]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._9_7_
                        ,_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u.
                         _M_first._M_storage._M_storage[8]);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           *)local_88);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           *)local_88);
        typeuse<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::WATParser::TypeUse> *)local_88,ctx,true);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                        (_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)local_88);
        if (_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\x01') {
          local_e0 = &local_d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,
                     type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_,
                     _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ +
                     type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
          if (local_e0 == &local_d0) {
            *puVar2 = local_d0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_c8;
          }
          else {
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_e0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                 local_d0;
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_d8;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                            ((long)&type.val.
                                    super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                            0x20));
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                            ((long)&type.val.
                                    super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                            0x20));
          bVar4 = Lexer::takeRParen(this);
          if (bVar4) {
            _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._39_1_ =
                 exports.val.
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_;
            exports.val.
            super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ = local_88;
            __x = (Result<wasm::WATParser::TypeUse> *)&DAT_00000008;
            if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                _M_storage._M_storage[0x18] == '\0') {
              __x = &type;
            }
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                      (&local_118,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)__x);
            pIVar5 = (ImportNames *)local_c0;
            if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                _M_u._24_1_ != '\0') {
              pIVar5 = (ImportNames *)0x0;
            }
            pIVar6 = (ImportNames *)local_148;
            if (_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._39_1_ != '\0') {
              pIVar6 = (ImportNames *)0x0;
            }
            NVar7.super_IString.str._M_str =
                 (char *)import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         ._32_8_;
            NVar7.super_IString.str._M_len = local_90;
            ParseModuleTypesCtx::addTag
                      ((Result<wasm::Ok> *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                       ctx,NVar7,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)pIVar6,pIVar5,
                       (TypeUse *)
                       ((long)&exports.val.
                               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                       (Index)sVar3);
            if (local_118.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_118.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_118.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_118.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                _M_storage._M_storage[0x18] == '\x01') {
              local_e0 = &local_d0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,
                         type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_,
                         _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u.
                         _0_8_ + type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 _32_8_);
              puVar2 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
              ;
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
              if (local_e0 == &local_d0) {
                *puVar2 = local_d0;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                     uStack_c8;
              }
              else {
                *(undefined8 **)
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_e0;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                     local_d0;
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_d8
              ;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&type.val.
                                        super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                + 0x20));
            }
            else {
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&type.val.
                                        super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                + 0x20));
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
            }
          }
          else {
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,"expected end of tag","");
            Lexer::err((Err *)((long)&type.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                              0x20),this,&local_100);
            puVar2 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
            puVar1 = (undefined1 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8);
            if ((undefined1 *)
                type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ == puVar1)
            {
              *puVar2 = CONCAT71(_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>
                                 .super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 _M_u._9_7_,
                                 _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>
                                 .super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 _M_u._M_first._M_storage._M_storage[8]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_2.val.
                                     super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                     ._M_u._9_7_,
                                     _val_2.val.
                                     super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                     ._M_u._M_first._M_storage._M_storage[8]);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                 _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_;
            _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ = 0;
            _val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[8] = '\0';
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = puVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)local_88);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         *)local_c0);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_148);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> tag(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("tag"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto type = typeuse(ctx);
  CHECK_ERR(type);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of tag");
  }

  CHECK_ERR(ctx.addTag(name, *exports, import.getPtr(), *type, pos));
  return Ok{};
}